

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813::LoadableGetStateBlock_w(ChElementHexaANCF_3813 *this)

{
  ChStateDelta *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_w
            ((ChElementHexaANCF_3813 *)
             ((this->super_ChElementHexahedron)._vptr_ChElementHexahedron[-7] + -0x80 +
             (long)&(this->m_StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>),in_ESI,in_RDX)
  ;
  return;
}

Assistant:

void ChElementHexaANCF_3813::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos_dt().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[1]->GetPos_dt().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[2]->GetPos_dt().eigen();
    mD.segment(block_offset + 9, 3) = m_nodes[3]->GetPos_dt().eigen();
    mD.segment(block_offset + 12, 3) = m_nodes[4]->GetPos_dt().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[5]->GetPos_dt().eigen();
    mD.segment(block_offset + 18, 3) = m_nodes[6]->GetPos_dt().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[7]->GetPos_dt().eigen();
}